

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.hpp
# Opt level: O1

intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 boost::xpressive::detail::
 optimize_regex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *peeker,long *tr,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *param_3)

{
  counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  undefined8 *puVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
  *this;
  _func_int **pp_Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  char cVar10;
  ushort uVar11;
  byte bVar22;
  char cVar23;
  byte bVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  undefined1 auVar20 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  
  if (*(char *)((long)tr + 0x21) == '\x01') {
    this = (line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
            *)operator_new(0x110);
    line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
    ::line_start_finder(this,param_3);
    peeker->_vptr_finder = (_func_int **)this;
    LOCK();
    pcVar1 = &(this->
              super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
    UNLOCK();
  }
  else {
    if ((int)tr[7] < 1) {
      puVar2 = (undefined8 *)*tr;
      lVar7 = 1;
      lVar8 = 0;
      lVar9 = 0;
      do {
        auVar20 = *(undefined1 (*) [16])(puVar2 + lVar7);
        auVar31._0_2_ = auVar20._0_2_ >> 1;
        auVar31._2_2_ = auVar20._2_2_ >> 1;
        auVar31._4_2_ = auVar20._4_2_ >> 1;
        auVar31._6_2_ = auVar20._6_2_ >> 1;
        auVar31._8_2_ = auVar20._8_2_ >> 1;
        auVar31._10_2_ = auVar20._10_2_ >> 1;
        auVar31._12_2_ = auVar20._12_2_ >> 1;
        auVar31._14_2_ = auVar20._14_2_ >> 1;
        auVar31 = auVar31 & _DAT_0016b0f0;
        uVar11 = CONCAT11(auVar20[1] - auVar31[1],auVar20[0] - auVar31[0]);
        uVar12 = CONCAT13(auVar20[3] - auVar31[3],CONCAT12(auVar20[2] - auVar31[2],uVar11));
        uVar13 = CONCAT15(auVar20[5] - auVar31[5],CONCAT14(auVar20[4] - auVar31[4],uVar12));
        uVar14 = CONCAT17(auVar20[7] - auVar31[7],CONCAT16(auVar20[6] - auVar31[6],uVar13));
        auVar15._0_10_ = CONCAT19(auVar20[9] - auVar31[9],CONCAT18(auVar20[8] - auVar31[8],uVar14));
        auVar15[10] = auVar20[10] - auVar31[10];
        auVar15[0xb] = auVar20[0xb] - auVar31[0xb];
        auVar17[0xc] = auVar20[0xc] - auVar31[0xc];
        auVar17._0_12_ = auVar15;
        auVar17[0xd] = auVar20[0xd] - auVar31[0xd];
        auVar19[0xe] = auVar20[0xe] - auVar31[0xe];
        auVar19._0_14_ = auVar17;
        auVar19[0xf] = auVar20[0xf] - auVar31[0xf];
        auVar31 = auVar19 & _DAT_0016b100;
        auVar20._0_2_ = uVar11 >> 2;
        auVar20._2_2_ = (ushort)((uint)uVar12 >> 0x12);
        auVar20._4_2_ = (ushort)((uint6)uVar13 >> 0x22);
        auVar20._6_2_ = (ushort)((ulong)uVar14 >> 0x32);
        auVar20._8_2_ = (ushort)((unkuint10)auVar15._0_10_ >> 0x42);
        auVar20._10_2_ = auVar15._10_2_ >> 2;
        auVar20._12_2_ = auVar17._12_2_ >> 2;
        auVar20._14_2_ = auVar19._14_2_ >> 2;
        auVar20 = auVar20 & _DAT_0016b100;
        cVar10 = auVar20[0] + auVar31[0];
        bVar22 = auVar20[1] + auVar31[1];
        uVar11 = CONCAT11(bVar22,cVar10);
        cVar23 = auVar20[2] + auVar31[2];
        bVar24 = auVar20[3] + auVar31[3];
        uVar12 = CONCAT13(bVar24,CONCAT12(cVar23,uVar11));
        cVar25 = auVar20[4] + auVar31[4];
        bVar26 = auVar20[5] + auVar31[5];
        uVar13 = CONCAT15(bVar26,CONCAT14(cVar25,uVar12));
        cVar27 = auVar20[6] + auVar31[6];
        bVar28 = auVar20[7] + auVar31[7];
        uVar14 = CONCAT17(bVar28,CONCAT16(cVar27,uVar13));
        cVar29 = auVar20[8] + auVar31[8];
        bVar30 = auVar20[9] + auVar31[9];
        auVar16._0_10_ = CONCAT19(bVar30,CONCAT18(cVar29,uVar14));
        auVar16[10] = auVar20[10] + auVar31[10];
        auVar16[0xb] = auVar20[0xb] + auVar31[0xb];
        auVar18[0xc] = auVar20[0xc] + auVar31[0xc];
        auVar18._0_12_ = auVar16;
        auVar18[0xd] = auVar20[0xd] + auVar31[0xd];
        auVar21[0xe] = auVar20[0xe] + auVar31[0xe];
        auVar21._0_14_ = auVar18;
        auVar21[0xf] = auVar20[0xf] + auVar31[0xf];
        auVar32[0] = (char)(uVar11 >> 4) + cVar10;
        auVar32[1] = (bVar22 >> 4) + bVar22;
        auVar32[2] = (char)(ushort)((uint)uVar12 >> 0x14) + cVar23;
        auVar32[3] = (bVar24 >> 4) + bVar24;
        auVar32[4] = (char)(ushort)((uint6)uVar13 >> 0x24) + cVar25;
        auVar32[5] = (bVar26 >> 4) + bVar26;
        auVar32[6] = (char)(ushort)((ulong)uVar14 >> 0x34) + cVar27;
        auVar32[7] = (bVar28 >> 4) + bVar28;
        auVar32[8] = (char)(ushort)((unkuint10)auVar16._0_10_ >> 0x44) + cVar29;
        auVar32[9] = (bVar30 >> 4) + bVar30;
        auVar32[10] = (char)(auVar16._10_2_ >> 4) + auVar16[10];
        auVar32[0xb] = (auVar16[0xb] >> 4) + auVar16[0xb];
        auVar32[0xc] = (char)(auVar18._12_2_ >> 4) + auVar18[0xc];
        auVar32[0xd] = (auVar18[0xd] >> 4) + auVar18[0xd];
        auVar32[0xe] = (char)(auVar21._14_2_ >> 4) + auVar21[0xe];
        auVar32[0xf] = (auVar21[0xf] >> 4) + auVar21[0xf];
        auVar20 = psadbw(auVar32 & _DAT_0016b110,(undefined1  [16])0x0);
        lVar8 = lVar8 + auVar20._0_8_;
        lVar9 = lVar9 + auVar20._8_8_;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 5);
      if (lVar9 + lVar8 == 0x100) {
        peeker->_vptr_finder = (_func_int **)0x0;
        return (intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )peeker;
      }
      pp_Var6 = (_func_int **)operator_new(0x38);
      *(undefined4 *)(pp_Var6 + 1) = 0;
      *pp_Var6 = (_func_int *)&PTR__finder_00197c30;
      p_Var3 = (_func_int *)puVar2[1];
      p_Var4 = (_func_int *)puVar2[2];
      p_Var5 = (_func_int *)puVar2[3];
      pp_Var6[2] = (_func_int *)*puVar2;
      pp_Var6[3] = p_Var3;
      pp_Var6[4] = p_Var4;
      pp_Var6[5] = p_Var5;
      pp_Var6[6] = (_func_int *)puVar2[4];
    }
    else {
      pp_Var6 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var6 + 1) = 0;
      *pp_Var6 = (_func_int *)&PTR__finder_00197be8;
    }
    peeker->_vptr_finder = pp_Var6;
    LOCK();
    *(int *)(pp_Var6 + 1) = *(int *)(pp_Var6 + 1) + 1;
    UNLOCK();
  }
  return (intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )peeker;
}

Assistant:

intrusive_ptr<finder<BidiIter> > optimize_regex
(
    xpression_peeker<typename iterator_value<BidiIter>::type> const &peeker
  , Traits const &tr
  , mpl::false_
)
{
    if(peeker.line_start())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new line_start_finder<BidiIter, Traits>(tr)
        );
    }
    else if(peeker.leading_simple_repeat())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new leading_simple_repeat_finder<BidiIter>()
        );
    }
    else if(256 != peeker.bitset().count())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new hash_peek_finder<BidiIter, Traits>(peeker.bitset())
        );
    }

    return intrusive_ptr<finder<BidiIter> >();
}